

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bottlecreatorgenerator.cpp
# Opt level: O2

string * __thiscall
BottleCreatorGenerator::getFieldType_abi_cxx11_
          (string *__return_storage_ptr__,BottleCreatorGenerator *this,int fieldIndex)

{
  reference pvVar1;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->fieldsType_,(long)fieldIndex);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BottleCreatorGenerator::getFieldType(int fieldIndex) {
    return fieldsType_.at(fieldIndex);
}